

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

void xercesc_4_0::XMLString::removeWS(XMLCh *toConvert,MemoryManager *param_2)

{
  ulong uVar1;
  XMLCh *pXVar2;
  
  if ((toConvert == (XMLCh *)0x0) || (pXVar2 = toConvert, *toConvert == L'\0')) {
    return;
  }
  do {
    uVar1 = (ulong)(ushort)*toConvert;
    if (uVar1 < 0x21) {
      if ((0x100002600U >> (uVar1 & 0x3f) & 1) == 0) {
        if (uVar1 == 0) {
          *pXVar2 = L'\0';
          return;
        }
        goto LAB_00258ed6;
      }
    }
    else {
LAB_00258ed6:
      *pXVar2 = *toConvert;
      pXVar2 = pXVar2 + 1;
    }
    toConvert = toConvert + 1;
  } while( true );
}

Assistant:

void XMLString::removeWS(XMLCh* toConvert, MemoryManager* const)
{
    // If no string, then its a failure
    if (( !toConvert ) || ( !*toConvert ))
        return;

    XMLCh* retPtr = toConvert;
    XMLCh* startPtr = toConvert;

    while (*startPtr)
    {
        if ( ( *startPtr != chCR)    &&
             ( *startPtr != chLF)    &&
             ( *startPtr != chHTab)  &&
             ( *startPtr != chSpace)  )
        {
            *retPtr++ = *startPtr;
        }

        startPtr++;
    }

    *retPtr = chNull;
}